

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super.c
# Opt level: O1

int Super_CommandSupergatesAnd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nInputs;
  uint nLevels;
  FILE *__s;
  uint fVerbose;
  
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nLevels = 3;
  nInputs = 4;
  do {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"ILvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar2 == -1) {
        Super2_Precompute(nInputs,nLevels,fVerbose);
        return 0;
      }
      if (iVar2 != 0x4c) break;
      nLevels = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      if ((int)nLevels < 0) goto LAB_0040b82f;
    }
    if (iVar2 != 0x49) break;
    nInputs = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
  } while (-1 < (int)nInputs);
LAB_0040b82f:
  fwrite("usage: super2 [-IL num] [-vh]\n",0x1e,1,__s);
  fwrite("\t         precomputes the supergates composed of AND2s and INVs\n",0x40,1,__s);
  fprintf(__s,"\t-I num : the max number of inputs to the supergate [default = %d]\n",(ulong)nInputs
         );
  fprintf(__s,"\t-L num : the max number of logic levels of gates [default = %d]\n",(ulong)nLevels);
  fwrite("\t-v     : enable verbose output\n",0x20,1,__s);
  fwrite("\t-h     : print the help message\n",0x21,1,__s);
  return 1;
}

Assistant:

int Super_CommandSupergatesAnd( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int nVarsMax, nLevels;
    int fVerbose;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    nVarsMax = 4;
    nLevels  = 3;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "ILvh")) != EOF ) 
    {
        switch (c) 
        {
            case 'I':
                nVarsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVarsMax < 0 ) 
                    goto usage;
                break;
            case 'L':
                nLevels = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nLevels < 0 ) 
                    goto usage;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    Super2_Precompute( nVarsMax, nLevels, fVerbose );

    return 0;

usage:
    fprintf( pErr, "usage: super2 [-IL num] [-vh]\n");
    fprintf( pErr, "\t         precomputes the supergates composed of AND2s and INVs\n" );  
    fprintf( pErr, "\t-I num : the max number of inputs to the supergate [default = %d]\n", nVarsMax );
    fprintf( pErr, "\t-L num : the max number of logic levels of gates [default = %d]\n", nLevels );
    fprintf( pErr, "\t-v     : enable verbose output\n");
    fprintf( pErr, "\t-h     : print the help message\n");
    return 1;       /* error exit */
}